

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int compare2u(void *a,void *b)

{
  if (*b <= *a) {
    if (*b < *a) {
      return 1;
    }
    if (*(uint *)((long)b + 4) <= *(uint *)((long)a + 4)) {
      return (int)(*(uint *)((long)b + 4) < *(uint *)((long)a + 4));
    }
  }
  return -1;
}

Assistant:

static int compare2u(const void* a, const void*b)
{
  unsigned int x = ((const unsigned int*)a)[0];
  unsigned int y = ((const unsigned int*)b)[0];
  if ( x < y)
    return -1;
  if ( x > y)
    return 1;
  x = ((const unsigned int*)a)[1];
  y = ((const unsigned int*)b)[1];
  if ( x < y)
    return -1;
  if ( x > y)
    return 1;
  return 0;
}